

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.hpp
# Opt level: O0

Maybe<rc::Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall
rc::shrinkable::
filter<std::__cxx11::string,rapidCheck_propImpl_Bech32TestRC_stringsTooLongAreRejected()::__0_const&>
          (shrinkable *this,
          Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *shrinkable,anon_class_1_0_00000001_for_m_predicate *pred)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  Maybe<rc::Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  MVar3;
  anon_class_1_1_89904f1f_for_m_mapper local_61;
  Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  anon_class_1_0_00000001_for_m_predicate *local_20;
  anon_class_1_0_00000001_for_m_predicate *pred_local;
  Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *shrinkable_local;
  
  local_20 = pred;
  pred_local = (anon_class_1_0_00000001_for_m_predicate *)shrinkable;
  shrinkable_local =
       (Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)this;
  Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  value(&local_40,shrinkable);
  bVar1 = rc::gen::detail::
          FilterGen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp:47:73)>
          ::anon_class_1_0_00000001_for_m_predicate::operator()(pred,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Shrinkable(&local_60,shrinkable);
    mapShrinks<std::__cxx11::string,rc::shrinkable::filter<std::__cxx11::string,rapidCheck_propImpl_Bech32TestRC_stringsTooLongAreRejected()::__0_const&>(rc::Shrinkable<std::__cxx11::string>,rapidCheck_propImpl_Bech32TestRC_stringsTooLongAreRejected()::__0_const&)::_lambda(rc::Seq<rc::Shrinkable<std::__cxx11::string>>&&)_1_>
              ((shrinkable *)local_58,&local_60,&local_61);
    Maybe<rc::Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::Maybe((Maybe<rc::Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this,local_58);
    Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Shrinkable(local_58);
    Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Shrinkable(&local_60);
    uVar2 = extraout_RDX_00;
  }
  else {
    Maybe<rc::Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::Maybe((Maybe<rc::Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this);
    uVar2 = extraout_RDX;
  }
  MVar3._8_8_ = uVar2;
  MVar3.m_storage = (Storage)this;
  return MVar3;
}

Assistant:

Maybe<Shrinkable<T>> filter(Shrinkable<T> shrinkable, Predicate &&pred) {
  if (!pred(shrinkable.value())) {
    return Nothing;
  }

  return shrinkable::mapShrinks(
      std::move(shrinkable),
      [=](Seq<Shrinkable<T>> &&shrinks) {
        return seq::mapMaybe(std::move(shrinks),
                             [=](Shrinkable<T> &&shrink) {
                               return shrinkable::filter(std::move(shrink),
                                                         pred);
                             });
      });
}